

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O1

int Mpm_ManExploreNewCut
              (Mpm_Man_t *p,Mig_Obj_t *pObj,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,Mpm_Cut_t *pCut2,
              int Required)

{
  Mig_Fan_t MVar1;
  Mig_Fan_t MVar2;
  Mig_Fan_t MVar3;
  Mpm_Cut_t *pMVar4;
  uint uVar5;
  Mpm_Cut_t *pMVar6;
  uint uVar7;
  Mpm_Cut_t *pMVar8;
  int iVar9;
  Mig_Fan_t MVar10;
  int iVar11;
  
  if (*(uint *)&pCut0->field_0x4 >> 0x1b < *(uint *)&pCut1->field_0x4 >> 0x1b) {
    pMVar4 = Mpm_ManMergeCuts(p,pCut1,pCut0,pCut2);
    if (pMVar4 == (Mpm_Cut_t *)0x0) goto LAB_0047d6bf;
    if (p->pPars->fUseTruth == 0) {
      pMVar6 = pMVar4;
      if (p->pPars->fUseDsd != 0) {
        MVar1 = pObj->pFans[0];
        MVar2 = pObj->pFans[1];
        MVar3 = pObj->pFans[2];
        MVar10 = (Mig_Fan_t)~(uint)MVar3;
        iVar11 = 3;
        pMVar4 = pCut0;
        pMVar8 = pCut1;
        if (((uint)MVar2 < 0xfffffffe) && (0xfffffffd < (uint)MVar3)) {
          uVar5 = (uint)MVar1 >> 1;
          uVar7 = (uint)MVar2 >> 1;
          if (uVar7 <= uVar5 && 0xfffffffd < (uint)MVar3) {
            iVar11 = 3 - (uint)(uVar7 < uVar5);
          }
          else {
            iVar11 = (uint)(uVar7 <= uVar5) * 2 + 1;
          }
        }
LAB_0047d721:
        uVar5 = Mpm_CutComputeDsd6(p,pMVar6,pMVar8,pMVar4,pCut2,(uint)MVar2 & 1,(uint)MVar1 & 1,
                                   (uint)MVar10 & 1,iVar11);
        pMVar4 = (Mpm_Cut_t *)(ulong)uVar5;
        if (uVar5 == 0) goto LAB_0047d6bf;
      }
    }
    else {
      MVar1 = pObj->pFans[0];
      MVar2 = pObj->pFans[1];
      MVar3 = pObj->pFans[2];
      MVar10 = (Mig_Fan_t)~(uint)MVar3;
      iVar11 = 3;
      pMVar6 = pCut0;
      pMVar8 = pCut1;
      if (((uint)MVar2 < 0xfffffffe) && (0xfffffffd < (uint)MVar3)) {
        uVar5 = (uint)MVar1 >> 1;
        uVar7 = (uint)MVar2 >> 1;
        if (uVar7 <= uVar5 && 0xfffffffd < (uint)MVar3) {
          iVar11 = 3 - (uint)(uVar7 < uVar5);
        }
        else {
          iVar11 = (uint)(uVar7 <= uVar5) * 2 + 1;
        }
      }
LAB_0047d650:
      Mpm_CutComputeTruth(p,pMVar4,pMVar8,pMVar6,pCut2,(uint)MVar2 & 1,(uint)MVar1 & 1,
                          (uint)MVar10 & 1,iVar11);
      pMVar6 = pMVar4;
    }
  }
  else {
    pMVar4 = Mpm_ManMergeCuts(p,pCut0,pCut1,pCut2);
    if (pMVar4 == (Mpm_Cut_t *)0x0) goto LAB_0047d6bf;
    if (p->pPars->fUseTruth != 0) {
      MVar2 = pObj->pFans[0];
      MVar1 = pObj->pFans[1];
      MVar10 = pObj->pFans[2];
      iVar11 = 3;
      pMVar6 = pCut1;
      pMVar8 = pCut0;
      if (((uint)MVar1 < 0xfffffffe) && (0xfffffffd < (uint)MVar10)) {
        uVar5 = (uint)MVar2 >> 1;
        uVar7 = (uint)MVar1 >> 1;
        if (uVar7 <= uVar5 && 0xfffffffd < (uint)MVar10) {
          iVar11 = 3 - (uint)(uVar7 < uVar5);
        }
        else {
          iVar11 = (uint)(uVar7 <= uVar5) * 2 + 1;
        }
      }
      goto LAB_0047d650;
    }
    pMVar6 = pMVar4;
    if (p->pPars->fUseDsd != 0) {
      MVar2 = pObj->pFans[0];
      MVar1 = pObj->pFans[1];
      MVar10 = pObj->pFans[2];
      iVar11 = 3;
      pMVar4 = pCut1;
      pMVar8 = pCut0;
      if (((uint)MVar1 < 0xfffffffe) && (0xfffffffd < (uint)MVar10)) {
        uVar5 = (uint)MVar2 >> 1;
        uVar7 = (uint)MVar1 >> 1;
        if (uVar7 <= uVar5 && 0xfffffffd < (uint)MVar10) {
          iVar11 = 3 - (uint)(uVar7 < uVar5);
        }
        else {
          iVar11 = (uint)(uVar7 <= uVar5) * 2 + 1;
        }
      }
      goto LAB_0047d721;
    }
  }
  uVar5 = *(uint *)&pMVar6->field_0x4;
  pMVar4 = (Mpm_Cut_t *)(ulong)uVar5;
  iVar11 = 0;
  if (0x7ffffff < uVar5) {
    pMVar4 = (Mpm_Cut_t *)(ulong)(uVar5 >> 0x1b);
    pMVar8 = (Mpm_Cut_t *)0x0;
    iVar11 = 0;
    do {
      if (pMVar6->pLeaves[(long)pMVar8] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      iVar9 = p->pLibLut->pLutDelays[(long)pMVar4][(long)pMVar8] +
              (p->vTimes).pArray[(uint)pMVar6->pLeaves[(long)pMVar8] >> 1];
      if (iVar11 <= iVar9) {
        iVar11 = iVar9;
      }
      pMVar8 = (Mpm_Cut_t *)((long)&pMVar8->hNext + 1);
    } while (pMVar4 != pMVar8);
  }
  if ((iVar11 <= Required) || (p->fMainRun == 0)) {
    iVar11 = Mpm_ObjAddCutToStore(p,pMVar6,iVar11);
    return iVar11;
  }
LAB_0047d6bf:
  return (int)pMVar4;
}

Assistant:

static inline int Mpm_ManExploreNewCut( Mpm_Man_t * p, Mig_Obj_t * pObj, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCut2, int Required )
{
    Mpm_Cut_t * pCut;
    int ArrTime;
#ifdef MIG_RUNTIME
abctime clk = clock();
#endif

    if ( pCut0->nLeaves >= pCut1->nLeaves )
    {
        pCut = Mpm_ManMergeCuts( p, pCut0, pCut1, pCut2 );
#ifdef MIG_RUNTIME
p->timeMerge += clock() - clk;
#endif
        if ( pCut == NULL )
            return 1;
        if ( p->pPars->fUseTruth )
            Mpm_CutComputeTruth( p, pCut, pCut0, pCut1, pCut2, Mig_ObjFaninC0(pObj), Mig_ObjFaninC1(pObj), Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ); 
        else if ( p->pPars->fUseDsd )
        {
            if ( !Mpm_CutComputeDsd6( p, pCut, pCut0, pCut1, pCut2, Mig_ObjFaninC0(pObj), Mig_ObjFaninC1(pObj), Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ) )
                return 1;
        }
    }
    else
    {
        pCut = Mpm_ManMergeCuts( p, pCut1, pCut0, pCut2 );
#ifdef MIG_RUNTIME
p->timeMerge += clock() - clk;
#endif
        if ( pCut == NULL )
            return 1;
        if ( p->pPars->fUseTruth )
            Mpm_CutComputeTruth( p, pCut, pCut1, pCut0, pCut2, Mig_ObjFaninC1(pObj), Mig_ObjFaninC0(pObj), 1 ^ Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ); 
        else if ( p->pPars->fUseDsd )
        {
            if ( !Mpm_CutComputeDsd6( p, pCut, pCut1, pCut0, pCut2, Mig_ObjFaninC1(pObj), Mig_ObjFaninC0(pObj), 1 ^ Mig_ObjFaninC2(pObj), Mig_ObjNodeType(pObj) ) )
                return 1;
        }
    }

#ifdef MIG_RUNTIME
clk = clock();
#endif
    ArrTime = Mpm_CutGetArrTime( p, pCut );
#ifdef MIG_RUNTIME
p->timeEval += clock() - clk;
#endif
    if ( p->fMainRun && ArrTime > Required )
        return 1;

#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
    Mpm_ObjAddCutToStore( p, pCut, ArrTime );
#ifdef MIG_RUNTIME
p->timeStore += Abc_Clock() - clk;
#endif

/*
    // return 0 if const or buffer cut is derived - reset all cuts to contain only one --- does not work
//    if ( pCut->nLeaves < 2 && p->nCutStore == 1 )
//        return 0;
    if ( pCut->nLeaves < 2 ) 
    {
        int i;
        assert( p->nCutStore >= 1 );
        for ( i = 1; i < p->nCutStore; i++ )
            Vec_PtrPush( &p->vFreeUnits, p->pCutStore[i] );
        p->nCutStore = 1;
        return 0;
    }
*/
    return 1;
}